

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

bool slang::caseZWildcardEqual(SVInt *lhs,SVInt *rhs)

{
  uint uVar1;
  SVInt *pSVar2;
  SVInt *pSVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  
  bVar6 = (lhs->super_SVIntStorage).unknownFlag;
  if ((bVar6 == false) && ((rhs->super_SVIntStorage).unknownFlag == false)) {
    bVar6 = exactlyEqual(lhs,rhs);
    return bVar6;
  }
  uVar8 = (lhs->super_SVIntStorage).bitWidth;
  uVar1 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar8 == uVar1) {
    bVar13 = uVar1 + 0x3f < 0x40;
    if (!bVar13) {
      pSVar2 = (SVInt *)(lhs->super_SVIntStorage).field_0.val;
      if (bVar6 != false) {
        lhs = pSVar2;
      }
      bVar13 = (rhs->super_SVIntStorage).unknownFlag;
      if (0x40 < uVar8) {
        lhs = pSVar2;
      }
      pSVar3 = (SVInt *)(rhs->super_SVIntStorage).field_0.val;
      if (bVar13 != false) {
        rhs = pSVar3;
      }
      if (0x40 < uVar1) {
        rhs = pSVar3;
      }
      uVar8 = uVar1 + 0x3f >> 6;
      lVar9 = 0;
      do {
        if (bVar6 == false) {
          uVar10 = 0xffffffffffffffff;
          uVar12 = 0;
        }
        else {
          uVar10 = *(ulong *)((long)&(pSVar2->super_SVIntStorage).field_0 + lVar9 + (ulong)uVar8 * 8
                             );
          uVar11 = *(ulong *)((long)&(pSVar2->super_SVIntStorage).field_0 + lVar9);
          uVar12 = ~uVar11 & uVar10;
          uVar10 = ~(uVar11 & uVar10);
        }
        if (bVar13 == false) {
          uVar11 = 0;
        }
        else {
          uVar4 = *(ulong *)((long)&(pSVar3->super_SVIntStorage).field_0 + lVar9 + (ulong)uVar8 * 8)
          ;
          uVar5 = *(ulong *)((long)&(pSVar3->super_SVIntStorage).field_0 + lVar9);
          uVar11 = ~uVar5 & uVar4;
          uVar10 = uVar10 & ~(uVar5 & uVar4);
        }
        if ((((*(ulong *)((long)&(rhs->super_SVIntStorage).field_0 + lVar9) ^
              *(ulong *)((long)&(lhs->super_SVIntStorage).field_0 + lVar9)) & uVar10) != 0) ||
           (((uVar11 ^ uVar12) & uVar10) != 0)) {
          return false;
        }
        lVar9 = lVar9 + 8;
      } while (uVar8 * 8 != (int)lVar9);
      bVar13 = true;
    }
  }
  else {
    bVar7 = (rhs->super_SVIntStorage).signFlag & (lhs->super_SVIntStorage).signFlag;
    if (uVar8 < uVar1) {
      if (bVar7 == 0) {
        SVInt::zext((SVInt *)&local_40,(bitwidth_t)lhs);
      }
      else {
        SVInt::sext((SVInt *)&local_40,(bitwidth_t)lhs);
      }
      bVar13 = caseZWildcardEqual((SVInt *)&local_40,rhs);
    }
    else {
      if (bVar7 == 0) {
        SVInt::zext((SVInt *)&local_40,(bitwidth_t)rhs);
      }
      else {
        SVInt::sext((SVInt *)&local_40,(bitwidth_t)rhs);
      }
      bVar13 = caseZWildcardEqual(lhs,(SVInt *)&local_40);
    }
    if (((0x40 < local_38) || ((local_33 & 1) != 0)) && ((void *)local_40.val != (void *)0x0)) {
      operator_delete__(local_40.pVal);
    }
  }
  return bVar13;
}

Assistant:

bool caseZWildcardEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!lhs.unknownFlag && !rhs.unknownFlag)
        return exactlyEqual(lhs, rhs);

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return caseZWildcardEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return caseZWildcardEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    uint32_t words = SVInt::getNumWords(rhs.bitWidth, false);
    for (uint32_t i = 0; i < words; ++i) {
        // bitmask to avoid comparing the Z bits on either side
        uint64_t mask = UINT64_MAX;

        uint64_t lunknown = 0;
        if (lhs.unknownFlag) {
            lunknown = lhs.pVal[i + words] & ~lhs.pVal[i];
            mask &= ~(lhs.pVal[i + words] & lhs.pVal[i]);
        }

        uint64_t runknown = 0;
        if (rhs.unknownFlag) {
            runknown = rhs.pVal[i + words] & ~rhs.pVal[i];
            mask &= ~(rhs.pVal[i + words] & rhs.pVal[i]);
        }

        if ((lhs.getRawData()[i] & mask) != (rhs.getRawData()[i] & mask) ||
            (lunknown & mask) != (runknown & mask)) {
            return false;
        }
    }

    return true;
}